

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::GenerateCPackPropertiesFile(cmGlobalGenerator *this)

{
  cmake *pcVar1;
  pointer puVar2;
  cmMakefile *this_00;
  bool bVar3;
  string *psVar4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_header *p_Var6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string path;
  string config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmCPackPropertiesGenerator cpackPropertiesGenerator;
  cmGeneratedFileStream file;
  string local_370;
  string local_350;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_330;
  cmCPackPropertiesGenerator local_318;
  undefined1 local_298 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  undefined8 local_280;
  char *local_278;
  undefined8 local_270;
  
  pcVar1 = this->CMakeInstance;
  puVar2 = (this->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(cmMakefile **)
             ((long)(puVar2->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t + 0x70);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_330,this_00,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&local_350,this_00);
  psVar4 = cmake::GetHomeOutputDirectory_abi_cxx11_(this->CMakeInstance);
  local_298._8_8_ = (psVar4->_M_dataplus)._M_p;
  local_298._0_8_ = psVar4->_M_string_length;
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_280 = 0x16;
  local_278 = "/CPackProperties.cmake";
  local_270 = 0;
  views._M_len = 2;
  views._M_array = (iterator)local_298;
  cmCatViews(&local_370,views);
  bVar3 = cmsys::SystemTools::FileExists(&local_370);
  if ((bVar3) || ((pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_370,false,None);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"# CPack properties\n",0x13);
    p_Var5 = (pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &(pcVar1->InstalledFiles)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var6) {
      do {
        cmCPackPropertiesGenerator::cmCPackPropertiesGenerator
                  (&local_318,
                   (cmLocalGenerator *)
                   (puVar2->_M_t).
                   super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                   _M_t,(cmInstalledFile *)(p_Var5 + 2),&local_330);
        cmScriptGenerator::Generate
                  (&local_318.super_cmScriptGenerator,(ostream *)local_298,&local_350,&local_330);
        cmScriptGenerator::~cmScriptGenerator(&local_318.super_cmScriptGenerator);
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var6);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_330);
  return true;
}

Assistant:

bool cmGlobalGenerator::GenerateCPackPropertiesFile()
{
  cmake::InstalledFilesMap const& installedFiles =
    this->CMakeInstance->GetInstalledFiles();

  const auto& lg = this->LocalGenerators[0];
  cmMakefile* mf = lg->GetMakefile();

  std::vector<std::string> configs =
    mf->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = mf->GetDefaultConfiguration();

  std::string path = cmStrCat(this->CMakeInstance->GetHomeOutputDirectory(),
                              "/CPackProperties.cmake");

  if (!cmSystemTools::FileExists(path) && installedFiles.empty()) {
    return true;
  }

  cmGeneratedFileStream file(path);
  file << "# CPack properties\n";

  for (auto const& i : installedFiles) {
    cmInstalledFile const& installedFile = i.second;

    cmCPackPropertiesGenerator cpackPropertiesGenerator(
      lg.get(), installedFile, configs);

    cpackPropertiesGenerator.Generate(file, config, configs);
  }

  return true;
}